

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O2

void Aig_ManRetimeMark(Aig_Man_t *p)

{
  undefined1 *puVar1;
  bool bVar2;
  uint __line;
  int iVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  char *__assertion;
  
  for (iVar7 = 0; iVar7 < p->vObjs->nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vObjs,iVar7);
    if ((pvVar4 != (void *)0x0) && ((*(byte *)((long)pvVar4 + 0x18) & 0x20) != 0)) {
      __assertion = "pObj->fMarkB == 0";
      __line = 0x4f;
      goto LAB_0058424c;
    }
  }
  for (iVar7 = 0; iVar3 = p->nRegs, iVar7 < p->nObjs[2] - iVar3; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCis,iVar7);
    *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) | 0x20;
  }
  iVar7 = 0;
  while( true ) {
    if (iVar3 <= iVar7) {
      bVar2 = true;
      while (bVar2) {
        Aig_ManIncrementTravId(p);
        bVar2 = false;
        for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar7);
          if ((pAVar5->field_0x18 & 0x20) == 0) {
            iVar3 = Aig_ManRetimeMark_rec(p,pAVar5);
            if (iVar3 != 0) {
              bVar2 = true;
              if ((pAVar5->field_0).pNext != (Aig_Obj_t *)0x0) {
                puVar1 = &((pAVar5->field_0).pNext)->field_0x18;
                *puVar1 = *puVar1 | 0x20;
                bVar2 = true;
              }
            }
          }
        }
      }
      for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
        pAVar5 = Aig_ManLi(p,iVar7);
        pAVar6 = Aig_ManLo(p,iVar7);
        (pAVar5->field_0).pNext = (Aig_Obj_t *)0x0;
        (pAVar6->field_0).pNext = (Aig_Obj_t *)0x0;
      }
      return;
    }
    pAVar5 = Aig_ManLi(p,iVar7);
    pAVar6 = Aig_ManLo(p,iVar7);
    if ((pAVar6->field_0).pNext != (Aig_Obj_t *)0x0) break;
    if ((pAVar5->field_0).pNext != (Aig_Obj_t *)0x0) {
      __assertion = "pObjLi->pNext == NULL";
      __line = 0x56;
      goto LAB_0058424c;
    }
    (pAVar6->field_0).pNext = pAVar5;
    (pAVar5->field_0).pNext = pAVar6;
    iVar7 = iVar7 + 1;
    iVar3 = p->nRegs;
  }
  __assertion = "pObjLo->pNext == NULL";
  __line = 0x55;
LAB_0058424c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRetF.c"
                ,__line,"void Aig_ManRetimeMark(Aig_Man_t *)");
}

Assistant:

void Aig_ManRetimeMark( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int fChange, i;
    // mark the PIs
    Aig_ManForEachObj( p, pObj, i )
        assert( pObj->fMarkB == 0 );
    Aig_ManForEachPiSeq( p, pObj, i )
        pObj->fMarkB = 1;
    // map registers into each other
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        assert( pObjLo->pNext == NULL );
        assert( pObjLi->pNext == NULL );
        pObjLo->pNext = pObjLi;
        pObjLi->pNext = pObjLo;
    }
    // iterativively mark the logic reachable from PIs
    fChange = 1;
    while ( fChange )
    {
        fChange = 0;
        Aig_ManIncrementTravId( p );
        Aig_ManForEachCo( p, pObj, i )
        {
            if ( pObj->fMarkB )
                continue;
            if ( Aig_ManRetimeMark_rec( p, pObj ) )
            {
                if ( pObj->pNext )
                    pObj->pNext->fMarkB = 1;
                fChange = 1;
            }
        }
    }
    // clean register mapping
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi->pNext = NULL;
}